

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

ParseLocation * __thiscall
embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
loc(Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this)

{
  long lVar1;
  runtime_error *this_00;
  reference pvVar2;
  long *in_RDI;
  size_t end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  ParseLocation l;
  type in_stack_fffffffffffffec8;
  ParseLocation *in_stack_fffffffffffffed0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  *in_stack_fffffffffffffee0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  local_d8;
  ulong local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  *local_88;
  string local_68 [32];
  undefined1 local_48 [40];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  *local_20;
  
  if (in_RDI[4] == 0) {
    local_20 = &local_d8;
    (**(code **)(*in_RDI + 0x28))(local_48);
    (**(code **)(*in_RDI + 0x20))(local_68);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_embree::ParseLocation_&,_true>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_68);
    ParseLocation::~ParseLocation((ParseLocation *)0x178e13);
    this_01 = &local_d8;
    local_88 = this_01;
    if (in_RDI[3] + in_RDI[4] == 0x400) {
      if (in_RDI[3] == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      in_RDI[2] = in_RDI[2] + 1U & 0x3ff;
      in_RDI[3] = in_RDI[3] + -1;
    }
    lVar1 = in_RDI[4];
    in_RDI[4] = lVar1 + 1;
    local_90 = (ulong)((int)in_RDI[2] + (int)in_RDI[3] + (int)lVar1 & 0x3ff);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
                  *)(in_RDI + 5),local_90);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::operator=(this_01,in_stack_fffffffffffffec8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::~pair(this_01);
  }
  pvVar2 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
           ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
                         *)(in_RDI + 5),in_RDI[2] + in_RDI[3] & 0x3ff);
  return &pvVar2->second;
}

Assistant:

const ParseLocation& loc() {
      if (future == 0) push_back(nextHelper());
      return buffer[(start+past)%BUF_SIZE].second;
    }